

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,2>,tcu::Matrix<float,4,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pMVar3;
  pointer pMVar4;
  Variable<tcu::Matrix<float,_4,_2>_> *pVVar5;
  pointer pcVar6;
  byte bVar7;
  double dVar8;
  undefined8 uVar9;
  ulong uVar10;
  pointer pSVar11;
  bool bVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  uint uVar15;
  _Base_ptr p_Var16;
  char *__s;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  IVal *pIVar20;
  long lVar21;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  long lVar23;
  Matrix<float,_4,_2> *val;
  IVal *pIVar24;
  PrecisionCase *pPVar25;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  *pVVar26;
  byte bVar27;
  FloatFormat *fmt;
  IVal in2;
  IVal in3;
  ostringstream os;
  Environment env;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  outputs;
  IVal in1;
  ShaderSpec spec;
  ostringstream oss;
  FuncSet funcs;
  undefined4 auStack_658 [2];
  PrecisionCase *local_650;
  string local_648;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  *local_628;
  size_t local_620;
  Statement *local_618;
  long local_610;
  ulong local_608;
  string local_600;
  ulong local_5e0;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_5d8;
  FloatFormat *local_5d0;
  ResultCollector *local_5c8;
  long local_5c0;
  undefined1 local_5b8 [8];
  pointer pVStack_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  double local_598;
  Data local_590;
  undefined4 local_580;
  double adStack_558 [2];
  ios_base local_548 [8];
  ios_base local_540 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_438;
  FloatFormat local_408;
  ulong local_3d8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  local_3d0;
  undefined1 local_3a0 [16];
  undefined1 local_390 [184];
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  local_2d8;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  vStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  undefined8 local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  undefined8 local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [96];
  undefined1 local_208 [16];
  undefined8 local_1f8 [33];
  undefined1 local_f0 [16];
  _Base_ptr local_e0 [3];
  double local_c8;
  IVal local_90;
  
  pMVar3 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar4 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_620 = (long)pMVar4 - (long)pMVar3 >> 5;
  local_628 = variables;
  local_618 = stmt;
  local_5d8 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_2>,_tcu::Matrix<float,_4,_2>_>_>
  ::Outputs(&local_3d0,local_620);
  local_2a8 = &local_298;
  local_390._176_4_ = 1;
  local_2d8.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_2c0.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_2c0.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_2c0.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_288 = &local_278;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  local_408.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_408.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_408.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_408.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_408.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_408.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_408.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_408.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_408._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_438._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_438._M_impl.super__Rb_tree_header._M_header;
  local_438._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_438._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_438._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_438._M_impl.super__Rb_tree_header._M_header._M_right =
       local_438._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_5b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"Statement: ",0xb);
  (*local_618->_vptr_Statement[2])(local_618,(ostringstream *)&pVStack_5b0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_650 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_5b0);
  std::ios_base::~ios_base(local_540);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_268);
  p_Var2 = (_Rb_tree_node_base *)(local_f0 + 8);
  local_f0._8_4_ = _S_red;
  local_e0[0] = (_Base_ptr)0x0;
  local_c8 = 0.0;
  local_e0[1] = p_Var2;
  local_e0[2] = p_Var2;
  (*local_618->_vptr_Statement[4])(local_618,local_f0);
  if (local_e0[1] != p_Var2) {
    p_Var16 = local_e0[1];
    do {
      (**(code **)(**(long **)(p_Var16 + 1) + 0x30))(*(long **)(p_Var16 + 1),local_268);
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != p_Var2);
  }
  pPVar25 = local_650;
  if (local_c8 != 0.0) {
    local_5b8 = (undefined1  [8])((local_650->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_5b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_5b0,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_5b0,(char *)local_3a0._0_8_,local_3a0._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_3a0._0_8_ != (IVal *)local_390) {
      operator_delete((void *)local_3a0._0_8_,local_390._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_5b0);
    std::ios_base::~ios_base(local_540);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_268);
  std::ios_base::~ios_base((ios_base *)local_1f8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,"precision ",10);
  __s = glu::getPrecisionName((pPVar25->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)auStack_658 + (int)*(undefined8 *)((long)local_5b8 + -0x18) + 0xa0);
  }
  else {
    sVar17 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,__s,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_268);
  pcVar6 = local_268 + 0x10;
  if ((pointer)local_268._0_8_ != pcVar6) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
  std::ios_base::~ios_base(local_548);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_650->m_ctx).renderContext)->_vptr_RenderContext[2])();
  pVVar26 = local_628;
  local_390._176_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_650->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                   "#extension ",&local_650->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_268);
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar22) {
      local_5a8._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_5a8._8_8_ = plVar18[3];
      local_5b8 = (undefined1  [8])&local_5a8;
    }
    else {
      local_5a8._M_allocated_capacity = paVar22->_M_allocated_capacity;
      local_5b8 = (undefined1  [8])*plVar18;
    }
    pVStack_5b0 = (pointer)plVar18[1];
    *plVar18 = (long)paVar22;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_5b8);
    if (local_5b8 != (undefined1  [8])&local_5a8) {
      operator_delete((void *)local_5b8,local_5a8._M_allocated_capacity + 1);
    }
    pVVar26 = local_628;
    if ((pointer)local_268._0_8_ != pcVar6) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize(&local_2d8,1);
  makeSymbol<tcu::Matrix<float,4,2>>
            ((Symbol *)local_5b8,local_650,
             (pVVar26->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr);
  pSVar11 = local_2d8.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=
            ((string *)
             local_2d8.
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start,(string *)local_5b8);
  glu::VarType::operator=(&pSVar11->varType,(VarType *)&local_598);
  glu::VarType::~VarType((VarType *)&local_598);
  if (local_5b8 != (undefined1  [8])&local_5a8) {
    operator_delete((void *)local_5b8,local_5a8._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize(&vStack_2c0,2);
  makeSymbol<tcu::Matrix<float,4,2>>
            ((Symbol *)local_5b8,local_650,
             (local_628->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr);
  pSVar11 = vStack_2c0.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=
            ((string *)
             (vStack_2c0.
              super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start + 1),(string *)local_5b8);
  glu::VarType::operator=(&pSVar11[1].varType,(VarType *)&local_598);
  glu::VarType::~VarType((VarType *)&local_598);
  pVVar26 = local_628;
  if (local_5b8 != (undefined1  [8])&local_5a8) {
    operator_delete((void *)local_5b8,local_5a8._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,4,2>>
            ((Symbol *)local_5b8,local_650,
             (pVVar26->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr);
  pSVar11 = vStack_2c0.
            super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=
            ((string *)
             vStack_2c0.
             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             ._M_impl.super__Vector_impl_data._M_start,(string *)local_5b8);
  glu::VarType::operator=(&pSVar11->varType,(VarType *)&local_598);
  glu::VarType::~VarType((VarType *)&local_598);
  if (local_5b8 != (undefined1  [8])&local_5a8) {
    operator_delete((void *)local_5b8,local_5a8._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
  (*local_618->_vptr_Statement[2])(local_618,local_5b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
  std::ios_base::~ios_base(local_548);
  std::__cxx11::string::operator=((string *)&local_288,(string *)local_268);
  if ((pointer)local_268._0_8_ != pcVar6) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  pPVar25 = local_650;
  pSVar19 = ShaderExecUtil::createExecutor
                      ((local_650->m_ctx).renderContext,(local_650->m_ctx).shaderType,
                       (ShaderSpec *)(local_390 + 0xb0));
  local_5b8 = (undefined1  [8])
              (local_5d8->in0).
              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_5b0 = (local_5d8->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_5a8._M_allocated_capacity =
       (size_type)
       (local_5d8->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_5a8._8_8_ =
       (local_5d8->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_268._0_8_ =
       local_3d0.out0.
       super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_268._8_8_ =
       local_3d0.out1.
       super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((pPVar25->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,local_620,local_5b8,local_268);
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_5b8);
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_268);
  pVVar26 = local_628;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_f0);
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_438,
             (pVVar26->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr,(IVal *)local_5b8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_438,
             (pVVar26->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_3a0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_438,
             (pVVar26->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_648);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_438,
             (pVVar26->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_600);
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_438,
             (pVVar26->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr,(IVal *)local_268);
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_438,
             (pVVar26->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr,(IVal *)local_f0);
  if (pMVar4 == pMVar3) {
LAB_017529b7:
    local_5b8 = (undefined1  [8])((pPVar25->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_5b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_5b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_5b0," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    fmt = &(pPVar25->m_ctx).floatFormat;
    local_5c8 = &pPVar25->m_status;
    local_3d8 = local_620 + (local_620 == 0);
    local_5c0 = 0;
    local_608 = 0;
    local_5e0 = 0;
    local_5d0 = fmt;
    do {
      tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_268);
      tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_f0);
      if ((local_608 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_650->super_TestCase).super_TestNode.m_testCtx);
      }
      pMVar3 = (local_5d8->in0).
               super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_648.field_2._M_allocated_capacity = 0;
      local_648.field_2._8_8_ = 0;
      local_648._M_dataplus._M_p = (char *)0x0;
      local_648._M_string_length = 0;
      lVar23 = 4;
      do {
        auStack_658[lVar23] =
             *(undefined4 *)((long)((pMVar3->m_data).m_data + -1) + lVar23 * 4 + local_5c0);
        *(undefined4 *)((long)&local_648._M_dataplus._M_p + lVar23 * 4) =
             *(undefined4 *)((long)(pMVar3->m_data).m_data[0].m_data + lVar23 * 4 + local_5c0);
        lVar23 = lVar23 + 1;
      } while (lVar23 != 8);
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doRound
                ((IVal *)local_3a0,fmt,(Matrix<float,_4,_2> *)&local_648);
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_5b8,fmt,(IVal *)local_3a0);
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_438,
                           (pVVar26->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      lVar23 = 0;
      do {
        *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[0].m_hi + lVar23) =
             *(undefined8 *)((long)&local_5a8 + lVar23);
        dVar8 = *(double *)((long)&pVStack_5b0 + lVar23);
        pbVar1 = &(pIVar20->m_data).m_data[0].m_data[0].m_hasNaN + lVar23;
        *(undefined8 *)pbVar1 = *(undefined8 *)(local_5b8 + lVar23);
        *(double *)(pbVar1 + 8) = dVar8;
        dVar8 = *(double *)((long)adStack_558 + lVar23 + 8);
        pbVar1 = &(pIVar20->m_data).m_data[1].m_data[0].m_hasNaN + lVar23;
        *(undefined8 *)pbVar1 = *(undefined8 *)((long)adStack_558 + lVar23);
        *(double *)(pbVar1 + 8) = dVar8;
        *(undefined8 *)((long)&(pIVar20->m_data).m_data[1].m_data[0].m_hi + lVar23) =
             *(undefined8 *)(local_548 + lVar23);
        lVar23 = lVar23 + 0x18;
      } while (lVar23 != 0x60);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_438,
                 (pVVar26->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_438,
                 (pVVar26->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_438,
                 (pVVar26->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_590.basic.type = (local_650->m_ctx).precision;
      local_598 = fmt->m_maxValue;
      local_5b8 = *(undefined1 (*) [8])fmt;
      pVStack_5b0 = *(pointer *)&fmt->m_fractionBits;
      local_5a8._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_5a8._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_580 = 0;
      local_590._8_8_ = &local_438;
      (*local_618->_vptr_Statement[3])(local_618,local_5b8);
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_438,
                           (pVVar26->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_5b8,&local_408,pIVar20);
      pMVar3 = local_3d0.out1.
               super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = local_608;
      lVar23 = 0;
      do {
        *(undefined8 *)((long)local_e0 + lVar23) = *(undefined8 *)((long)&local_5a8 + lVar23);
        *(undefined8 *)(local_f0 + lVar23) = *(undefined8 *)(local_5b8 + lVar23);
        *(undefined8 *)(local_f0 + lVar23 + 8) = *(undefined8 *)((long)&pVStack_5b0 + lVar23);
        uVar9 = *(undefined8 *)((long)adStack_558 + lVar23 + 8);
        *(undefined8 *)(&local_90.m_data[0].m_hasNaN + lVar23) =
             *(undefined8 *)((long)adStack_558 + lVar23);
        *(undefined8 *)((long)&local_90.m_data[0].m_lo + lVar23) = uVar9;
        *(undefined8 *)((long)&local_90.m_data[0].m_hi + lVar23) =
             *(undefined8 *)(local_548 + lVar23);
        lVar23 = lVar23 + 0x18;
      } while (lVar23 != 0x60);
      local_610 = local_608 * 0x20;
      bVar27 = 1;
      lVar23 = 0;
      pIVar24 = (IVal *)local_f0;
      do {
        bVar12 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                           (pIVar24,pMVar3[uVar10].m_data.m_data + lVar23);
        lVar23 = 1;
        bVar7 = bVar27 & bVar12;
        bVar27 = 0;
        pIVar24 = &local_90;
      } while (bVar7 != 0);
      local_5b8 = (undefined1  [8])&local_5a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5b8,"Shader output 1 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(local_5c8,bVar12,(string *)local_5b8);
      if (local_5b8 != (undefined1  [8])&local_5a8) {
        operator_delete((void *)local_5b8,(ulong)(local_5a8._M_allocated_capacity + 1));
      }
      pIVar20 = Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_438,
                           (pVVar26->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_5b8,&local_408,pIVar20);
      pMVar3 = local_3d0.out0.
               super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar23 = local_610;
      lVar21 = 0;
      do {
        *(undefined8 *)(local_268 + lVar21 + 0x10) = *(undefined8 *)((long)&local_5a8 + lVar21);
        *(undefined8 *)(local_268 + lVar21) = *(undefined8 *)(local_5b8 + lVar21);
        *(undefined8 *)(local_268 + lVar21 + 8) = *(undefined8 *)((long)&pVStack_5b0 + lVar21);
        uVar9 = *(undefined8 *)((long)adStack_558 + lVar21 + 8);
        *(undefined8 *)(local_208 + lVar21) = *(undefined8 *)((long)adStack_558 + lVar21);
        *(undefined8 *)(local_208 + lVar21 + 8) = uVar9;
        *(undefined8 *)((long)local_1f8 + lVar21) = *(undefined8 *)(local_548 + lVar21);
        lVar21 = lVar21 + 0x18;
      } while (lVar21 != 0x60);
      bVar27 = 1;
      lVar21 = 0;
      pIVar24 = (IVal *)local_268;
      do {
        bVar13 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                           (pIVar24,(Vector<float,_4> *)
                                    ((long)(pMVar3->m_data).m_data[lVar21].m_data + lVar23));
        lVar21 = 1;
        bVar7 = bVar27 & bVar13;
        bVar27 = 0;
        pIVar24 = (IVal *)local_208;
      } while (bVar7 != 0);
      local_5b8 = (undefined1  [8])&local_5a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5b8,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_5c8,bVar13,(string *)local_5b8);
      fmt = local_5d0;
      pVVar26 = local_628;
      if (local_5b8 != (undefined1  [8])&local_5a8) {
        operator_delete((void *)local_5b8,(ulong)(local_5a8._M_allocated_capacity + 1));
      }
      if (!bVar12 || !bVar13) {
        uVar15 = (int)local_5e0 + 1;
        local_5e0 = (ulong)uVar15;
        fmt = local_5d0;
        if ((int)uVar15 < 0x65) {
          local_5b8 = (undefined1  [8])((local_650->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_5b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"\t",1);
          pVVar5 = (pVVar26->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                   .m_ptr;
          val = (Matrix<float,_4,_2> *)local_390;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_3a0._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3a0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_5b0,(char *)local_3a0._0_8_,local_3a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0," = ",3);
          valueToString<tcu::Matrix<float,4,2>>
                    (&local_648,(BuiltinPrecisionTests *)&local_408,
                     (FloatFormat *)
                     ((long)(((local_5d8->in0).
                              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                     local_610),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_5b0,local_648._M_dataplus._M_p,local_648._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_648._M_dataplus._M_p != &local_648.field_2) {
            operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_4,_2> *)local_3a0._0_8_ != (Matrix<float,_4,_2> *)local_390) {
            operator_delete((void *)local_3a0._0_8_,local_390._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"\t",1);
          pVVar5 = (pVVar26->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_390;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_3a0._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3a0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_5b0,(char *)local_3a0._0_8_,local_3a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0," = ",3);
          valueToString<tcu::Matrix<float,4,2>>
                    (&local_648,(BuiltinPrecisionTests *)&local_408,
                     (FloatFormat *)
                     ((long)((local_3d0.out0.
                              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                     local_610),(Matrix<float,_4,_2> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_5b0,local_648._M_dataplus._M_p,local_648._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_5b0,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,4,2>>
                    (&local_600,(BuiltinPrecisionTests *)&local_408,(FloatFormat *)local_268,pIVar20
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_5b0,local_600._M_dataplus._M_p,local_600._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_600._M_dataplus._M_p != &local_600.field_2) {
            operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_648._M_dataplus._M_p != &local_648.field_2) {
            operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_3a0._0_8_ != (IVal *)local_390) {
            operator_delete((void *)local_3a0._0_8_,local_390._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"\t",1);
          pVVar5 = (pVVar26->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_390;
          pcVar6 = (pVVar5->m_name)._M_dataplus._M_p;
          local_3a0._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3a0,pcVar6,pcVar6 + (pVVar5->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_5b0,(char *)local_3a0._0_8_,local_3a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0," = ",3);
          valueToString<tcu::Matrix<float,4,2>>
                    (&local_648,(BuiltinPrecisionTests *)&local_408,
                     (FloatFormat *)
                     ((long)((local_3d0.out1.
                              super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                     local_610),(Matrix<float,_4,_2> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_5b0,local_648._M_dataplus._M_p,local_648._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_5b0,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,4,2>>
                    (&local_600,(BuiltinPrecisionTests *)&local_408,(FloatFormat *)local_f0,pIVar20)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_5b0,local_600._M_dataplus._M_p,local_600._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_600._M_dataplus._M_p != &local_600.field_2) {
            operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_648._M_dataplus._M_p != &local_648.field_2) {
            operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_3a0._0_8_ != (IVal *)local_390) {
            operator_delete((void *)local_3a0._0_8_,local_390._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_5b0);
          std::ios_base::~ios_base(local_540);
          fmt = local_5d0;
        }
      }
      pPVar25 = local_650;
      local_608 = local_608 + 1;
      local_5c0 = local_5c0 + 0x20;
    } while (local_608 != local_3d8);
    iVar14 = (int)local_5e0;
    if (iVar14 < 0x65) {
      if (iVar14 == 0) goto LAB_017529b7;
    }
    else {
      local_5b8 = (undefined1  [8])((local_650->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_5b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_5b0,iVar14 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_5b0);
      std::ios_base::~ios_base(local_540);
    }
    local_5b8 = (undefined1  [8])((pPVar25->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_5b0);
    std::ostream::operator<<((ostringstream *)&pVStack_5b0,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_5b0,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_5b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_5b0," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_5b0);
  std::ios_base::~ios_base(local_540);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_438);
  if (local_288 != &local_278) {
    operator_delete(local_288,
                    CONCAT71(local_278._M_allocated_capacity._1_7_,local_278._M_local_buf[0]) + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,
                    CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector(&vStack_2c0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector(&local_2d8);
  if (local_3d0.out1.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d0.out1.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d0.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3d0.out0.
      super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d0.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d0.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}